

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O3

void anon_unknown.dwarf_412ef0::createImplicitNets
               (HierarchicalInstanceSyntax *instance,ASTContext *context,NetType *netType,
               SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_8UL>_>
               *implicitNetNames,SmallVectorBase<const_slang::ast::Symbol_*> *results)

{
  char *pcVar1;
  SyntaxKind SVar2;
  Scope *pSVar3;
  Compilation *this;
  pointer pTVar4;
  PortConnectionSyntax *this_00;
  OrderedPortConnectionSyntax *pOVar5;
  NamedPortConnectionSyntax *pNVar6;
  NetSymbol *pNVar7;
  long lVar8;
  size_t index;
  SyntaxNode *expr;
  ulong uVar9;
  size_t sVar10;
  long lVar11;
  SeparatedSyntaxList<slang::syntax::PortConnectionSyntax> *this_01;
  pair<ska::detailv3::sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_8UL>_>::templated_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>,_bool>
  pVar12;
  Token t;
  SmallVector<slang::parsing::Token,_8UL> implicitNets;
  string_view local_128;
  Token local_118;
  size_t local_100;
  SeparatedSyntaxList<slang::syntax::PortConnectionSyntax> *local_f8;
  size_t local_f0;
  SmallVectorBase<const_slang::ast::Symbol_*> *local_e8;
  NetType *local_e0;
  long local_d8;
  SourceLocation local_d0;
  SmallVectorBase<slang::parsing::Token> local_c8 [3];
  
  if ((netType->netKind != Unknown) &&
     (uVar9 = (instance->connections).elements.size_ + 1, 1 < uVar9)) {
    this_01 = &instance->connections;
    sVar10 = uVar9 >> 1;
    index = 0;
    local_100 = sVar10;
    local_f8 = this_01;
    local_e8 = results;
    local_e0 = netType;
    do {
      this_00 = slang::syntax::SeparatedSyntaxList<slang::syntax::PortConnectionSyntax>::operator[]
                          (this_01,index);
      SVar2 = (this_00->super_SyntaxNode).kind;
      if (SVar2 == NamedPortConnection) {
        pNVar6 = slang::syntax::SyntaxNode::as<slang::syntax::NamedPortConnectionSyntax>
                           (&this_00->super_SyntaxNode);
        expr = &pNVar6->expr->super_SyntaxNode;
        if (expr != (SyntaxNode *)0x0) goto LAB_001c41f1;
      }
      else if (SVar2 == OrderedPortConnection) {
        pOVar5 = slang::syntax::SyntaxNode::as<slang::syntax::OrderedPortConnectionSyntax>
                           (&this_00->super_SyntaxNode);
        expr = &((pOVar5->expr).ptr)->super_SyntaxNode;
        if (expr == (SyntaxNode *)0x0) {
          slang::assert::assertFailed
                    ("ptr",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                     ,0x26,
                     "T slang::not_null<slang::syntax::PropertyExprSyntax *>::get() const [T = slang::syntax::PropertyExprSyntax *]"
                    );
        }
LAB_001c41f1:
        local_c8[0].len = 0;
        local_c8[0].cap = 8;
        local_f0 = index;
        local_c8[0].data_ = (pointer)local_c8[0].firstElement;
        slang::ast::Expression::findPotentiallyImplicitNets(expr,context,local_c8);
        pTVar4 = local_c8[0].data_;
        if (local_c8[0].len != 0) {
          lVar8 = local_c8[0].len << 4;
          lVar11 = 0;
          local_d8 = lVar8;
          do {
            pcVar1 = (char *)((long)&pTVar4->kind + lVar11);
            local_118._0_8_ = *(undefined8 *)pcVar1;
            local_118.info = *(Info **)(pcVar1 + 8);
            local_128 = slang::parsing::Token::valueText(&local_118);
            pVar12 = ska::detailv3::
                     sherwood_v3_table<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<unsigned_long,std::hash<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<bool,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,std::char_traits<char>>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,std::char_traits<char>>>,8ul>>
                     ::emplace<std::basic_string_view<char,std::char_traits<char>>>
                               ((sherwood_v3_table<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<unsigned_long,std::hash<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<bool,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,std::char_traits<char>>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,std::char_traits<char>>>,8ul>>
                                 *)&implicitNetNames->
                                    super_flat_hash_set<std::basic_string_view<char>,_std::hash<basic_string_view<char,_char_traits<char>_>_>,_std::equal_to<basic_string_view<char,_char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char>_>,_8UL>_>
                                ,&local_128);
            if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              pSVar3 = (context->scope).ptr;
              if (pSVar3 == (Scope *)0x0) {
                slang::assert::assertFailed
                          ("ptr",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                           ,0x26,
                           "T slang::not_null<const slang::ast::Scope *>::get() const [T = const slang::ast::Scope *]"
                          );
              }
              this = pSVar3->compilation;
              local_128 = slang::parsing::Token::valueText(&local_118);
              local_d0 = slang::parsing::Token::location(&local_118);
              pNVar7 = slang::BumpAllocator::
                       emplace<slang::ast::NetSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::NetType_const&>
                                 (&this->super_BumpAllocator,&local_128,&local_d0,local_e0);
              (pNVar7->super_ValueSymbol).declaredType.type = this->logicType;
              local_128._M_len = (size_t)pNVar7;
              slang::SmallVectorBase<slang::ast::Symbol_const*>::
              emplace_back<slang::ast::Symbol_const*>
                        ((SmallVectorBase<slang::ast::Symbol_const*> *)local_e8,
                         (Symbol **)&local_128);
              lVar8 = local_d8;
            }
            lVar11 = lVar11 + 0x10;
          } while (lVar8 != lVar11);
        }
        index = local_f0;
        sVar10 = local_100;
        this_01 = local_f8;
        if (local_c8[0].data_ != (pointer)local_c8[0].firstElement) {
          free(local_c8[0].data_);
          this_01 = local_f8;
        }
      }
      index = index + 1;
    } while (index != sVar10);
  }
  return;
}

Assistant:

void createImplicitNets(const HierarchicalInstanceSyntax& instance, const ASTContext& context,
                        const NetType& netType, SmallSet<string_view, 8>& implicitNetNames,
                        SmallVectorBase<const Symbol*>& results) {
    // If no default nettype is set, we don't create implicit nets.
    if (netType.isError())
        return;

    for (auto conn : instance.connections) {
        const PropertyExprSyntax* expr = nullptr;
        switch (conn->kind) {
            case SyntaxKind::OrderedPortConnection:
                expr = conn->as<OrderedPortConnectionSyntax>().expr;
                break;
            case SyntaxKind::NamedPortConnection:
                expr = conn->as<NamedPortConnectionSyntax>().expr;
                break;
            default:
                break;
        }

        if (!expr)
            continue;

        SmallVector<Token, 8> implicitNets;
        Expression::findPotentiallyImplicitNets(*expr, context, implicitNets);

        for (Token t : implicitNets) {
            if (implicitNetNames.emplace(t.valueText()).second) {
                auto& comp = context.getCompilation();
                auto net = comp.emplace<NetSymbol>(t.valueText(), t.location(), netType);
                net->setType(comp.getLogicType());
                results.push_back(net);
            }
        }
    }
}